

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O2

char * crn_get_mip_mode_name(crn_mip_mode m)

{
  if (m < cCRNMipModeTotal) {
    return &DAT_001890c0 + *(int *)(&DAT_001890c0 + (ulong)m * 4);
  }
  return "?";
}

Assistant:

const char* crn_get_mip_mode_name(crn_mip_mode m) {
  switch (m) {
    case cCRNMipModeUseSourceOrGenerateMips:
      return "UseSourceOrGenerate";
    case cCRNMipModeUseSourceMips:
      return "UseSource";
    case cCRNMipModeGenerateMips:
      return "Generate";
    case cCRNMipModeNoMips:
      return "None";
    default:
      break;
  }
  return "?";
}